

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_constants.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_2::ValidateSpecConstant(ValidationState_t *_,Instruction *inst)

{
  DiagnosticStream *this;
  DiagnosticStream local_210;
  Op local_34;
  Instruction *pIStack_30;
  Op type_opcode;
  Instruction *type_instruction;
  Instruction *pIStack_20;
  uint type_id;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  pIStack_20 = inst;
  inst_local = (Instruction *)_;
  type_instruction._4_4_ = val::Instruction::GetOperandAs<unsigned_int_const>(inst,0);
  pIStack_30 = ValidationState_t::FindDef((ValidationState_t *)inst_local,type_instruction._4_4_);
  local_34 = val::Instruction::opcode(pIStack_30);
  if ((local_34 == OpTypeInt) || (local_34 == OpTypeFloat)) {
    __local._4_4_ = SPV_SUCCESS;
  }
  else {
    ValidationState_t::diag
              (&local_210,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,pIStack_20);
    this = DiagnosticStream::operator<<
                     (&local_210,
                      (char (*) [69])
                      "Specialization constant must be an integer or floating-point number.");
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(this);
    DiagnosticStream::~DiagnosticStream(&local_210);
  }
  return __local._4_4_;
}

Assistant:

spv_result_t ValidateSpecConstant(ValidationState_t& _,
                                  const Instruction* inst) {
  // Operand 0 is the <id> of the type that we're specializing to.
  auto type_id = inst->GetOperandAs<const uint32_t>(0);
  auto type_instruction = _.FindDef(type_id);
  auto type_opcode = type_instruction->opcode();
  if (type_opcode != spv::Op::OpTypeInt &&
      type_opcode != spv::Op::OpTypeFloat) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst) << "Specialization constant "
                                                   "must be an integer or "
                                                   "floating-point number.";
  }
  return SPV_SUCCESS;
}